

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

ArgList * __thiscall
CompilerContext::get_args
          (ArgList *__return_storage_ptr__,CompilerContext *this,Command *command,
          vector<linb::any,_std::allocator<linb::any>_> *params)

{
  any *paVar1;
  CompilerContext *this_00;
  any *param;
  
  (__return_storage_ptr__->
  super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (CompilerContext *)
            (((long)(params->super__Vector_base<linb::any,_std::allocator<linb::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(params->super__Vector_base<linb::any,_std::allocator<linb::any>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::reserve(__return_storage_ptr__,(size_type)this_00);
  paVar1 = (params->super__Vector_base<linb::any,_std::allocator<linb::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (param = (params->super__Vector_base<linb::any,_std::allocator<linb::any>_>)._M_impl.
               super__Vector_impl_data._M_start; param != paVar1; param = param + 1) {
    get_arg((ArgVariant *)&stack0xffffffffffffffa8,this_00,param);
    this_00 = (CompilerContext *)&stack0xffffffffffffffa8;
    std::
    vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
    ::
    emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
              ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                *)__return_storage_ptr__,
               (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                *)&stack0xffffffffffffffa8);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&stack0xffffffffffffffa8);
  }
  return __return_storage_ptr__;
}

Assistant:

auto CompilerContext::get_args(const Command& command, const std::vector<any>& params) -> ArgList
{
    ArgList args;
    args.reserve(params.size());

    for(auto& p : params)
        args.emplace_back(get_arg(p));

    return args;
}